

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_stat_print_ex(mi_stat_count_t *stat,char *msg,int64_t unit,mi_output_fun *out,void *arg,
                     char *notok)

{
  mi_output_fun *in_RCX;
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *in_R8;
  char *in_R9;
  void *in_stack_ffffffffffffffb8;
  mi_output_fun *in_stack_ffffffffffffffc0;
  int64_t in_stack_ffffffffffffffc8;
  
  _mi_fprintf(in_RCX,in_R8,"%10s:",in_RSI);
  if (in_RDX == 0) {
    mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
    mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
    _mi_fprintf(in_RCX,in_R8,"%11s"," ");
    mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
    _mi_fprintf(in_RCX,in_R8,"\n");
  }
  else {
    if (in_RDX < 1) {
      mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
      mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
      mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
      if (in_RDX == -1) {
        _mi_fprintf(in_RCX,in_R8,"%24s","");
      }
      else {
        mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffb8);
        mi_print_count((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8);
      }
    }
    else {
      mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
      mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
      mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
      mi_print_amount((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
      mi_print_count((int64_t)in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffb8);
    }
    if (*(long *)(in_RDI + 0x10) == 0) {
      _mi_fprintf(in_RCX,in_R8,"  ok\n");
    }
    else {
      _mi_fprintf(in_RCX,in_R8,"  ");
      if (in_R9 == (char *)0x0) {
        in_R9 = "not all freed";
      }
      _mi_fprintf(in_RCX,in_R8,in_R9);
      _mi_fprintf(in_RCX,in_R8,"\n");
    }
  }
  return;
}

Assistant:

static void mi_stat_print_ex(const mi_stat_count_t* stat, const char* msg, int64_t unit, mi_output_fun* out, void* arg, const char* notok ) {
  _mi_fprintf(out, arg,"%10s:", msg);
  if (unit != 0) {
    if (unit > 0) {
      mi_print_amount(stat->peak, unit, out, arg);
      mi_print_amount(stat->total, unit, out, arg);
      // mi_print_amount(stat->freed, unit, out, arg);
      mi_print_amount(stat->current, unit, out, arg);
      mi_print_amount(unit, 1, out, arg);
      mi_print_count(stat->total, unit, out, arg);
    }
    else {
      mi_print_amount(stat->peak, -1, out, arg);
      mi_print_amount(stat->total, -1, out, arg);
      // mi_print_amount(stat->freed, -1, out, arg);
      mi_print_amount(stat->current, -1, out, arg);
      if (unit == -1) {
        _mi_fprintf(out, arg, "%24s", "");
      }
      else {
        mi_print_amount(-unit, 1, out, arg);
        mi_print_count((stat->total / -unit), 0, out, arg);
      }
    }
    if (stat->current != 0) {
      _mi_fprintf(out, arg, "  ");
      _mi_fprintf(out, arg, (notok == NULL ? "not all freed" : notok));
      _mi_fprintf(out, arg, "\n");
    }
    else {
      _mi_fprintf(out, arg, "  ok\n");
    }
  }
  else {
    mi_print_amount(stat->peak, 1, out, arg);
    mi_print_amount(stat->total, 1, out, arg);
    _mi_fprintf(out, arg, "%11s", " ");  // no freed
    mi_print_amount(stat->current, 1, out, arg);
    _mi_fprintf(out, arg, "\n");
  }
}